

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Vector.h
# Opt level: O1

T_INDEX __thiscall
Nova::Grid<float,_1>::Clamp_To_Cell(Grid<float,_1> *this,TV *X,int number_of_ghost_cells)

{
  TV *value;
  int in_ECX;
  int iVar1;
  int iVar2;
  undefined4 in_register_00000014;
  int iVar3;
  
  iVar2 = (int)((*(float *)CONCAT44(in_register_00000014,number_of_ghost_cells) -
                X[1]._data._M_elems[0]) * X[4]._data._M_elems[0]) + 1;
  iVar1 = in_ECX + (int)(X->_data)._M_elems[0];
  iVar3 = 1 - in_ECX;
  if (1 - in_ECX < iVar2) {
    iVar3 = iVar2;
  }
  if (iVar1 < iVar3) {
    iVar3 = iVar1;
  }
  (this->counts)._data._M_elems[0] = iVar3;
  return (T_INDEX)SUB84(this,0);
}

Assistant:

Vector(const Vector& other)
        :_data(other._data)
    {}